

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

uint32 rw::d3d::calculateTextureSize(uint32 width,uint32 height,uint32 depth,uint32 format)

{
  uint uVar1;
  uint32 uVar2;
  
  uVar2 = 0;
  if ((int)depth < 0x31545844) {
    switch(depth) {
    case 0x14:
      return height * width * 3;
    case 0x15:
    case 0x16:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x43:
    case 0x47:
    case 0x4b:
    case 0x4d:
    case 0x4f:
      uVar2 = height * width * 4;
      break;
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1d:
    case 0x1e:
    case 0x28:
    case 0x33:
    case 0x3c:
    case 0x3d:
    case 0x46:
    case 0x49:
    case 0x50:
switchD_00116ab7_caseD_17:
      uVar2 = height * width * 2;
      break;
    case 0x1b:
    case 0x1c:
    case 0x29:
    case 0x32:
    case 0x34:
      uVar2 = height * width;
      break;
    default:
      goto switchD_00116ab7_caseD_23;
    }
    return uVar2;
  }
  if ((int)depth < 0x33545844) {
    if (depth != 0x31545844) {
      if (depth != 0x32545844) {
        if (depth != 0x32595559) {
          return 0;
        }
        goto switchD_00116ab7_caseD_17;
      }
      goto LAB_00116b1a;
    }
    uVar1 = width * 2 + 6 & 0xfffffff8;
  }
  else {
    if ((int)depth < 0x35545844) {
      if ((depth != 0x33545844) && (depth != 0x34545844)) {
        return 0;
      }
    }
    else if (depth != 0x35545844) {
      if (depth != 0x59565955) {
        return 0;
      }
      goto switchD_00116ab7_caseD_17;
    }
LAB_00116b1a:
    uVar1 = width * 4 + 0xc & 0xfffffff0;
  }
  uVar2 = uVar1 * (height + 3 >> 2);
switchD_00116ab7_caseD_23:
  return uVar2;
}

Assistant:

static uint32
calculateTextureSize(uint32 width, uint32 height, uint32 depth, uint32 format)
{
#define D3DFMT_W11V11U10 65
	switch(format){
	default:
	case D3DFMT_UNKNOWN:
		return 0;
	case D3DFMT_R3G3B2:
	case D3DFMT_A8:
	case D3DFMT_P8:
	case D3DFMT_L8:
	case D3DFMT_A4L4:
		return width * height * depth;
	case D3DFMT_R5G6B5:
	case D3DFMT_X1R5G5B5:
	case D3DFMT_A1R5G5B5:
	case D3DFMT_A4R4G4B4:
	case D3DFMT_A8R3G3B2:
	case D3DFMT_X4R4G4B4:
	case D3DFMT_A8P8:
	case D3DFMT_A8L8:
	case D3DFMT_V8U8:
	case D3DFMT_L6V5U5:
	case D3DFMT_D16_LOCKABLE:
	case D3DFMT_D15S1:
	case D3DFMT_D16:
	case D3DFMT_UYVY:
	case D3DFMT_YUY2:
		return width * 2 * height * depth;
	case D3DFMT_R8G8B8:
		return width * 3 * height * depth;
	case D3DFMT_A8R8G8B8:
	case D3DFMT_X8R8G8B8:
	case D3DFMT_A2B10G10R10:
	case D3DFMT_A8B8G8R8:
	case D3DFMT_X8B8G8R8:
	case D3DFMT_G16R16:
	case D3DFMT_X8L8V8U8:
	case D3DFMT_Q8W8V8U8:
	case D3DFMT_V16U16:
	case D3DFMT_W11V11U10:
	case D3DFMT_A2W10V10U10:
	case D3DFMT_D32:
	case D3DFMT_D24S8:
	case D3DFMT_D24X8:
	case D3DFMT_D24X4S4:
		return width * 4 * height * depth;
	case D3DFMT_DXT1:
		assert(depth <= 1);
		return ((width + 3) >> 2) * ((height + 3) >> 2) * 8;
	case D3DFMT_DXT2:
	case D3DFMT_DXT3:
	case D3DFMT_DXT4:
	case D3DFMT_DXT5:
		assert(depth <= 1);
		return ((width + 3) >> 2) * ((height + 3) >> 2) * 16;
	}
}